

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateTemplateNode::ExpandOnce
          (TemplateTemplateNode *this,ExpandEmitter *output_buffer,
          TemplateDictionaryInterface *dictionary,char *filename,PerExpandData *per_expand_data,
          TemplateCache *cache)

{
  TemplateCache *pTVar1;
  TemplateDictionaryInterface *pTVar2;
  bool bVar3;
  char *in;
  size_t inlen;
  TemplateAnnotator *pTVar4;
  TemplateString local_e8;
  TemplateString local_c8;
  undefined1 local_a8 [8];
  StringEmitter subtemplate_buffer;
  string sub_template;
  TemplateCache *local_48;
  TemplateCache *cache_ptr;
  TemplateCache *pTStack_38;
  bool error_free;
  TemplateCache *cache_local;
  PerExpandData *per_expand_data_local;
  char *filename_local;
  TemplateDictionaryInterface *dictionary_local;
  ExpandEmitter *output_buffer_local;
  TemplateTemplateNode *this_local;
  
  cache_ptr._7_1_ = 1;
  local_48 = cache;
  pTStack_38 = cache;
  cache_local = (TemplateCache *)per_expand_data;
  per_expand_data_local = (PerExpandData *)filename;
  filename_local = (char *)dictionary;
  dictionary_local = (TemplateDictionaryInterface *)output_buffer;
  output_buffer_local = (ExpandEmitter *)this;
  bVar3 = PerExpandData::annotate(per_expand_data);
  if (bVar3) {
    pTVar4 = PerExpandData::annotator((PerExpandData *)cache_local);
    pTVar2 = dictionary_local;
    TemplateToken::ToString_abi_cxx11_((TemplateToken *)&stack0xffffffffffffff98);
    (*pTVar4->_vptr_TemplateAnnotator[2])(pTVar4,pTVar2,(TemplateToken *)&stack0xffffffffffffff98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  bVar3 = AnyMightModify(&(this->token_).modvals,(PerExpandData *)cache_local);
  pTVar1 = local_48;
  if (bVar3) {
    std::__cxx11::string::string((string *)&subtemplate_buffer.outbuf_);
    StringEmitter::StringEmitter((StringEmitter *)local_a8,(string *)&subtemplate_buffer.outbuf_);
    pTVar1 = local_48;
    TemplateString::TemplateString(&local_c8,(char *)per_expand_data_local);
    bVar3 = TemplateCache::ExpandLocked
                      (pTVar1,&local_c8,this->strip_,(ExpandEmitter *)local_a8,
                       (TemplateDictionaryInterface *)filename_local,(PerExpandData *)cache_local);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      in = (char *)std::__cxx11::string::data();
      inlen = std::__cxx11::string::size();
      EmitModifiedString(&(this->token_).modvals,in,inlen,(PerExpandData *)cache_local,
                         (ExpandEmitter *)dictionary_local);
    }
    else {
      EmitMissingInclude((char *)per_expand_data_local,(ExpandEmitter *)dictionary_local,
                         (PerExpandData *)cache_local);
      cache_ptr._7_1_ = 0;
    }
    StringEmitter::~StringEmitter((StringEmitter *)local_a8);
    std::__cxx11::string::~string((string *)&subtemplate_buffer.outbuf_);
  }
  else {
    TemplateString::TemplateString(&local_e8,(char *)per_expand_data_local);
    bVar3 = TemplateCache::ExpandLocked
                      (pTVar1,&local_e8,this->strip_,(ExpandEmitter *)dictionary_local,
                       (TemplateDictionaryInterface *)filename_local,(PerExpandData *)cache_local);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      EmitMissingInclude((char *)per_expand_data_local,(ExpandEmitter *)dictionary_local,
                         (PerExpandData *)cache_local);
      cache_ptr._7_1_ = 0;
    }
  }
  bVar3 = PerExpandData::annotate((PerExpandData *)cache_local);
  if (bVar3) {
    pTVar4 = PerExpandData::annotator((PerExpandData *)cache_local);
    (*pTVar4->_vptr_TemplateAnnotator[3])(pTVar4,dictionary_local);
  }
  return (bool)(cache_ptr._7_1_ & 1);
}

Assistant:

bool TemplateTemplateNode::ExpandOnce(
    ExpandEmitter *output_buffer,
    const TemplateDictionaryInterface &dictionary,
    const char* const filename,
    PerExpandData *per_expand_data,
    const TemplateCache *cache) const {
  bool error_free = true;
  // NOTE: Although we do this const_cast here, if the cache is frozen
  // the expansion doesn't mutate the cache, and is effectively 'const'.
  TemplateCache* cache_ptr = const_cast<TemplateCache*>(cache);

  // Expand the included template once for each "template specific"
  // dictionary.  Normally this will only iterate once, but it's
  // possible to supply a list of more than one sub-dictionary and
  // then the template explansion will be iterative, just as though
  // the included template were an iterated section.
  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitOpenInclude(output_buffer,
                                                  token_.ToString());
  }
  // sub-dictionary NULL means 'just use the current dictionary instead'.
  // We force children to annotate the output if we have to.
  // If the include-template has modifiers, we need to expand to a string,
  // modify the string, and append to output_buffer.  Otherwise (common
  // case), we can just expand into the output-buffer directly.
  if (AnyMightModify(token_.modvals, per_expand_data)) {
    string sub_template;
    StringEmitter subtemplate_buffer(&sub_template);
    if (!cache_ptr->ExpandLocked(filename, strip_,
                                 &subtemplate_buffer,
                                 &dictionary,
                                 per_expand_data)) {
      EmitMissingInclude(filename, output_buffer, per_expand_data);
      error_free = false;
    } else {
      EmitModifiedString(token_.modvals,
                         sub_template.data(), sub_template.size(),
                         per_expand_data, output_buffer);
    }
  } else {
    // No need to modify sub-template
    if (!cache_ptr->ExpandLocked(filename, strip_,
                                 output_buffer,
                                 &dictionary,
                                 per_expand_data)) {
      EmitMissingInclude(filename, output_buffer, per_expand_data);
      error_free = false;
    }
  }
  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitCloseInclude(output_buffer);
  }
  return error_free;
}